

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmGhsMultiTargetGenerator::WriteCustomCommandsHelper
          (cmGhsMultiTargetGenerator *this,ostream *fout,cmCustomCommandGenerator *ccg)

{
  pointer pbVar1;
  uint uVar2;
  string *psVar3;
  char *__s;
  long lVar4;
  long lVar5;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  pointer pbVar7;
  char cVar8;
  uint c_00;
  string_view source;
  string_view source_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmdLines;
  string cdCmd;
  string cmd;
  string workingDir;
  string dir;
  cmAlphaNum local_f0;
  cmAlphaNum local_c0;
  string cdStr;
  string check_error;
  string local_50;
  
  cmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     (&this->LocalGenerator->super_cmLocalGenerator);
  std::__cxx11::string::string((string *)&dir,(string *)psVar3);
  cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_(&workingDir,ccg);
  if (workingDir._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&dir);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&check_error,"if [ $? -ne 0 ]; then exit 1; fi",(allocator<char> *)&local_c0)
  ;
  __s = cmCustomCommandGenerator::GetComment(ccg);
  if ((__s != (char *)0x0) && (*__s != '\0')) {
    local_c0.View_._M_len = 5;
    local_c0.View_._M_str = "echo ";
    local_f0.View_._M_len = strlen(__s);
    local_f0.View_._M_str = __s;
    cmStrCat<>(&cdCmd,&local_c0,&local_f0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cmdLines,&cdCmd
              );
    std::__cxx11::string::~string((string *)&cdCmd);
  }
  cdCmd._M_dataplus._M_p = (pointer)&cdCmd.field_2;
  cdCmd._M_string_length = 0;
  cdCmd.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cdStr,"cd ",(allocator<char> *)&local_c0);
  source._M_str = dir._M_dataplus._M_p;
  source._M_len = dir._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            ((string *)&local_f0,
             &(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,source,SHELL);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                 &cdStr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_f0);
  std::__cxx11::string::operator=((string *)&cdCmd,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cmdLines,&cdCmd);
  c_00 = 0;
  while( true ) {
    uVar2 = cmCustomCommandGenerator::GetNumberOfCommands(ccg);
    pbVar1 = cmdLines.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (uVar2 <= c_00) break;
    cmCustomCommandGenerator::GetCommand_abi_cxx11_(&cmd,ccg,c_00);
    if (cmd._M_string_length != 0) {
      cmsys::SystemTools::ReplaceString(&cmd,"/./","/");
      cVar8 = (char)&cmd;
      lVar4 = std::__cxx11::string::find(cVar8,0x2f);
      if (workingDir._M_string_length == 0) {
        cmOutputConverter::MaybeRelativeToCurBinDir
                  ((string *)&local_c0,
                   &(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,&cmd);
        std::__cxx11::string::operator=((string *)&cmd,(string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      lVar5 = std::__cxx11::string::find(cVar8,0x2f);
      if ((lVar4 != -1) && (lVar5 == -1)) {
        local_c0.View_._M_len = 2;
        local_c0.View_._M_str = "./";
        local_f0.View_._M_len = cmd._M_string_length;
        local_f0.View_._M_str = cmd._M_dataplus._M_p;
        cmStrCat<>(&local_50,&local_c0,&local_f0);
        std::__cxx11::string::operator=((string *)&cmd,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      source_00._M_str = cmd._M_dataplus._M_p;
      source_00._M_len = cmd._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                ((string *)&local_c0,
                 &(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,source_00,
                 SHELL);
      std::__cxx11::string::operator=((string *)&cmd,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      cmCustomCommandGenerator::AppendArguments(ccg,c_00,&cmd);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cmdLines,&cmd
                );
    }
    std::__cxx11::string::~string((string *)&cmd);
    c_00 = c_00 + 1;
  }
  for (pbVar7 = cmdLines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1) {
    poVar6 = std::operator<<(fout,(string *)pbVar7);
    poVar6 = std::operator<<(poVar6,'\n');
    poVar6 = std::operator<<(poVar6,(string *)&check_error);
    std::operator<<(poVar6,'\n');
  }
  std::__cxx11::string::~string((string *)&cdStr);
  std::__cxx11::string::~string((string *)&cdCmd);
  std::__cxx11::string::~string((string *)&check_error);
  std::__cxx11::string::~string((string *)&workingDir);
  std::__cxx11::string::~string((string *)&dir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cmdLines);
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteCustomCommandsHelper(
  std::ostream& fout, cmCustomCommandGenerator const& ccg)
{
  std::vector<std::string> cmdLines;

  // if the command specified a working directory use it.
  std::string dir = this->LocalGenerator->GetCurrentBinaryDirectory();
  std::string workingDir = ccg.GetWorkingDirectory();
  if (!workingDir.empty()) {
    dir = workingDir;
  }

  // Line to check for error between commands.
#ifdef _WIN32
  std::string check_error = "if %errorlevel% neq 0 exit /b %errorlevel%";
#else
  std::string check_error = "if [ $? -ne 0 ]; then exit 1; fi";
#endif

#ifdef _WIN32
  cmdLines.push_back("@echo off");
#endif
  // Echo the custom command's comment text.
  const char* comment = ccg.GetComment();
  if (comment && *comment) {
    std::string echocmd = cmStrCat("echo ", comment);
    cmdLines.push_back(std::move(echocmd));
  }

  // Switch to working directory
  std::string cdCmd;
#ifdef _WIN32
  std::string cdStr = "cd /D ";
#else
  std::string cdStr = "cd ";
#endif
  cdCmd = cdStr +
    this->LocalGenerator->ConvertToOutputFormat(dir, cmOutputConverter::SHELL);
  cmdLines.push_back(std::move(cdCmd));

  for (unsigned int c = 0; c < ccg.GetNumberOfCommands(); ++c) {
    // Build the command line in a single string.
    std::string cmd = ccg.GetCommand(c);
    if (!cmd.empty()) {
      // Use "call " before any invocations of .bat or .cmd files
      // invoked as custom commands in the WindowsShell.
      //
      bool useCall = false;

#ifdef _WIN32
      std::string suffix;
      if (cmd.size() > 4) {
        suffix = cmSystemTools::LowerCase(cmd.substr(cmd.size() - 4));
        if (suffix == ".bat" || suffix == ".cmd") {
          useCall = true;
        }
      }
#endif

      cmSystemTools::ReplaceString(cmd, "/./", "/");
      // Convert the command to a relative path only if the current
      // working directory will be the start-output directory.
      bool had_slash = cmd.find('/') != std::string::npos;
      if (workingDir.empty()) {
        cmd = this->LocalGenerator->MaybeRelativeToCurBinDir(cmd);
      }
      bool has_slash = cmd.find('/') != std::string::npos;
      if (had_slash && !has_slash) {
        // This command was specified as a path to a file in the
        // current directory.  Add a leading "./" so it can run
        // without the current directory being in the search path.
        cmd = cmStrCat("./", cmd);
      }
      cmd = this->LocalGenerator->ConvertToOutputFormat(
        cmd, cmOutputConverter::SHELL);
      if (useCall) {
        cmd = cmStrCat("call ", cmd);
      }
      ccg.AppendArguments(c, cmd);
      cmdLines.push_back(std::move(cmd));
    }
  }

  // push back the custom commands
  for (auto const& c : cmdLines) {
    fout << c << '\n' << check_error << '\n';
  }
}